

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmLocalGenerator *this_00;
  cmMakefile *makefile;
  pointer puVar1;
  __type _Var2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  string *psVar6;
  string *__rhs;
  pointer ppcVar7;
  pointer puVar8;
  string_view str;
  string_view str_00;
  string_view str_01;
  string targetName;
  string compiler;
  string fastTarget;
  char *in_stack_ffffffffffffff20;
  string local_a0;
  pointer local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&local_a0);
  psVar5 = cmMakefile::GetRequiredDefinition(mf,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_80 = ppcVar7;
  if (ppcVar7 !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"all",(allocator<char> *)&local_50);
    AppendTarget(this,fout,&local_a0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (psVar5->_M_dataplus)._M_p,mf,in_stack_ffffffffffffff20,sourceFileFlags,true);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"clean",(allocator<char> *)&local_50);
    AppendTarget(this,fout,&local_a0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (psVar5->_M_dataplus)._M_p,mf,in_stack_ffffffffffffff20,sourceFileFlags,false);
    std::__cxx11::string::~string((string *)&local_a0);
    ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_80 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  }
  do {
    if (ppcVar7 == local_80) {
      std::__cxx11::string::~string((string *)&local_70);
      return;
    }
    this_00 = *ppcVar7;
    makefile = this_00->Makefile;
    puVar1 = (this_00->GeneratorTargets).
             super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_78 = ppcVar7;
    for (puVar8 = (this_00->GeneratorTargets).
                  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
    {
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((puVar8->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      std::__cxx11::string::string((string *)&local_a0,(string *)psVar6);
      TVar4 = cmGeneratorTarget::GetType
                        ((puVar8->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (TVar4 < UTILITY) {
        AppendTarget(this,fout,&local_a0,this_00,
                     (puVar8->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                     (psVar5->_M_dataplus)._M_p,makefile,in_stack_ffffffffffffff20,sourceFileFlags,
                     false);
        cmStrCat<std::__cxx11::string&,char_const(&)[6]>(&local_50,&local_a0,(char (*) [6])0x6b70b5)
        ;
        AppendTarget(this,fout,&local_50,this_00,
                     (puVar8->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                     (psVar5->_M_dataplus)._M_p,makefile,in_stack_ffffffffffffff20,sourceFileFlags,
                     false);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else if (TVar4 == UTILITY) {
        str._M_str = local_a0._M_dataplus._M_p;
        str._M_len = local_a0._M_string_length;
        bVar3 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])"Nightly");
        if ((((!bVar3) || (bVar3 = std::operator!=(&local_a0,"Nightly"), !bVar3)) &&
            ((str_00._M_str = local_a0._M_dataplus._M_p, str_00._M_len = local_a0._M_string_length,
             bVar3 = cmHasLiteralPrefix<11ul>(str_00,(char (*) [11])"Continuous"), !bVar3 ||
             (bVar3 = std::operator!=(&local_a0,"Continuous"), !bVar3)))) &&
           ((str_01._M_str = local_a0._M_dataplus._M_p, str_01._M_len = local_a0._M_string_length,
            bVar3 = cmHasLiteralPrefix<13ul>(str_01,(char (*) [13])"Experimental"), !bVar3 ||
            (bVar3 = std::operator!=(&local_a0,"Experimental"), !bVar3)))) {
LAB_0032a2f3:
          AppendTarget(this,fout,&local_a0,this_00,(cmGeneratorTarget *)0x0,
                       (psVar5->_M_dataplus)._M_p,makefile,in_stack_ffffffffffffff20,sourceFileFlags
                       ,false);
        }
      }
      else if (TVar4 == GLOBAL_TARGET) {
        psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
        __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
        _Var2 = std::operator==(psVar6,__rhs);
        if (_Var2) goto LAB_0032a2f3;
      }
      std::__cxx11::string::~string((string *)&local_a0);
    }
    ppcVar7 = local_78 + 1;
  } while( true );
}

Assistant:

void cmExtraSublimeTextGenerator::AppendAllTargets(
  const std::vector<cmLocalGenerator*>& lgs, const cmMakefile* mf,
  cmGeneratedFileStream& fout, MapSourceFileFlags& sourceFileFlags)
{
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler;
  if (!lgs.empty()) {
    this->AppendTarget(fout, "all", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, true);
    this->AppendTarget(fout, "clean", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, false);
  }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                               makefile, compiler.c_str(), sourceFileFlags,
                               false);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, lg, target.get(), make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(fout, fastTarget, lg, target.get(), make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
        } break;
        default:
          break;
      }
    }
  }
}